

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-target.inc.c
# Opt level: O0

void tgen_arithi(TCGContext_conflict9 *s,int c,int r0,tcg_target_long val,int cf)

{
  uint r;
  uint local_28;
  int is_inc;
  int rexw;
  int cf_local;
  tcg_target_long val_local;
  int r0_local;
  int c_local;
  TCGContext_conflict9 *s_local;
  
  local_28 = c & 0xfffffff8;
  r = c & 7;
  if (((cf == 0) && ((r == 0 || (r == 5)))) && ((val == 1 || (val == -1)))) {
    tcg_out_modrm(s,local_28 + 0xff,(uint)((r == 0) == val < 0),r0);
    return;
  }
  if (r == 4) {
    if (val == 0xffffffff) {
      tcg_out_ext32u(s,r0,r0);
      return;
    }
    if (val == (val & 0xffffffffU)) {
      local_28 = 0;
    }
    if (val == 0xff) {
      tcg_out_ext8u(s,r0,r0);
      return;
    }
    if (val == 0xffff) {
      tcg_out_ext16u(s,r0,r0);
      return;
    }
  }
  if (val == (char)(uint8_t)val) {
    tcg_out_modrm(s,local_28 + 0x83,r,r0);
    tcg_out8(s,(uint8_t)val);
  }
  else {
    if ((local_28 != 0) && (val != (int)(uint32_t)val)) {
      fprintf(_stderr,"%s:%d: tcg fatal error\n",
              "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/i386/tcg-target.inc.c"
              ,0x517);
      abort();
    }
    tcg_out_modrm(s,local_28 + 0x81,r,r0);
    tcg_out32(s,(uint32_t)val);
  }
  return;
}

Assistant:

static void tgen_arithi(TCGContext *s, int c, int r0,
                        tcg_target_long val, int cf)
{
    int rexw = 0;

    if (TCG_TARGET_REG_BITS == 64) {
        rexw = c & -8;
        c &= 7;
    }

    /* ??? While INC is 2 bytes shorter than ADDL $1, they also induce
       partial flags update stalls on Pentium4 and are not recommended
       by current Intel optimization manuals.  */
    if (!cf && (c == ARITH_ADD || c == ARITH_SUB) && (val == 1 || val == -1)) {
        int is_inc = (c == ARITH_ADD) ^ (val < 0);
        if (TCG_TARGET_REG_BITS == 64) {
            /* The single-byte increment encodings are re-tasked as the
               REX prefixes.  Use the MODRM encoding.  */
            tcg_out_modrm(s, OPC_GRP5 + rexw,
                          (is_inc ? EXT5_INC_Ev : EXT5_DEC_Ev), r0);
        } else {
            tcg_out8(s, (is_inc ? OPC_INC_r32 : OPC_DEC_r32) + r0);
        }
        return;
    }

    if (c == ARITH_AND) {
        if (TCG_TARGET_REG_BITS == 64) {
            if (val == 0xffffffffu) {
                tcg_out_ext32u(s, r0, r0);
                return;
            }
            if (val == (uint32_t)val) {
                /* AND with no high bits set can use a 32-bit operation.  */
                rexw = 0;
            }
        }
        if (val == 0xffu && (r0 < 4 || TCG_TARGET_REG_BITS == 64)) {
            tcg_out_ext8u(s, r0, r0);
            return;
        }
        if (val == 0xffffu) {
            tcg_out_ext16u(s, r0, r0);
            return;
        }
    }

    if (val == (int8_t)val) {
        tcg_out_modrm(s, OPC_ARITH_EvIb + rexw, c, r0);
        tcg_out8(s, val);
        return;
    }
    if (rexw == 0 || val == (int32_t)val) {
        tcg_out_modrm(s, OPC_ARITH_EvIz + rexw, c, r0);
        tcg_out32(s, val);
        return;
    }

    tcg_abort();
}